

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiverImpl.cpp
# Opt level: O1

bool Diligent::
     AddObjectToArchive<Diligent::SerializedResourceSignatureImpl,Diligent::IPipelineResourceSignature>
               (IPipelineResourceSignature *pObject,char *ObjectTypeStr,
               INTERFACE_ID *SerializedObjIID,mutex *Mtx,
               unordered_map<Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>_>_>_>
               *Objects)

{
  SerializedResourceSignatureImpl *this;
  bool bVar1;
  int iVar2;
  PipelineResourceSignatureDesc *pPVar3;
  undefined4 extraout_var;
  bool bVar4;
  char (*in_R9) [74];
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>_>,_false,_false>,_bool>
  pVar5;
  RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl> pSerializedObj;
  string msg;
  Char *Name;
  RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl> local_70;
  string local_68;
  char *local_40;
  Char *local_38;
  
  local_40 = ObjectTypeStr;
  if (pObject == (IPipelineResourceSignature *)0x0) {
    FormatString<char_const*,char[18]>
              (&local_68,(Diligent *)&local_40,(char **)0x83d571,(char (*) [18])Mtx);
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"AddObjectToArchive",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverImpl.cpp"
               ,0x109);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    bVar4 = false;
  }
  else {
    local_70.m_pObject = (SerializedResourceSignatureImpl *)0x0;
    if (pObject != (IPipelineResourceSignature *)0x0) {
      (**(pObject->super_IDeviceObject).super_IObject._vptr_IObject)
                (pObject,SerializedObjIID,&local_70);
    }
    if (local_70.m_pObject == (SerializedResourceSignatureImpl *)0x0) {
      iVar2 = (*(pObject->super_IDeviceObject).super_IObject._vptr_IObject[4])(pObject);
      FormatString<char_const*,char[3],char_const*,char[45]>
                (&local_68,(Diligent *)&local_40,(char **)0x7feced,
                 (char (*) [3])CONCAT44(extraout_var,iVar2),
                 (char **)"\' was not created by a serialization device.",(char (*) [45])in_R9);
      DebugAssertionFailed
                (local_68._M_dataplus._M_p,"AddObjectToArchive",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverImpl.cpp"
                 ,0x110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      bVar4 = false;
    }
    else {
      pPVar3 = SerializedResourceSignatureImpl::GetDesc(local_70.m_pObject);
      local_38 = (pPVar3->super_DeviceObjectAttribs).Name;
      iVar2 = pthread_mutex_lock((pthread_mutex_t *)Mtx);
      if (iVar2 != 0) {
        std::__throw_system_error(iVar2);
      }
      HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_68,local_38,true);
      pVar5 = std::
              _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::
              _M_emplace<Diligent::HashMapStringKey,Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>&>
                        ((_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)Objects,&local_68,&local_70);
      if ((local_68._M_dataplus._M_p != (Char *)0x0) && ((long)local_68._M_string_length < 0)) {
        operator_delete__(local_68._M_dataplus._M_p);
      }
      bVar4 = true;
      if (((((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (this = *(SerializedResourceSignatureImpl **)
                   ((long)pVar5.first.
                          super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>_>,_false>
                          ._M_cur.
                          super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>_>,_false>
                   + 0x18), this != local_70.m_pObject)) &&
         (bVar1 = SerializedResourceSignatureImpl::operator==(this,local_70.m_pObject), !bVar1)) {
        FormatString<char_const*,char[13],char_const*,char[74]>
                  (&local_68,(Diligent *)&local_40,(char **)0x8124b3,(char (*) [13])&local_38,
                   (char **)
                   "\' is already present in the archive. All objects must use distinct names.",
                   in_R9);
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(2,local_68._M_dataplus._M_p,0,0,0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        bVar4 = false;
      }
      pthread_mutex_unlock((pthread_mutex_t *)Mtx);
    }
    RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>::Release(&local_70);
  }
  return bVar4;
}

Assistant:

bool AddObjectToArchive(IfaceType*                                                           pObject,
                        const char*                                                          ObjectTypeStr,
                        const INTERFACE_ID&                                                  SerializedObjIID,
                        std::mutex&                                                          Mtx,
                        std::unordered_map<HashMapStringKey, RefCntAutoPtr<ObjectImplType>>& Objects)
{
    DEV_CHECK_ERR(pObject != nullptr, ObjectTypeStr, " must not be null");
    if (pObject == nullptr)
        return false;

    RefCntAutoPtr<ObjectImplType> pSerializedObj{pObject, SerializedObjIID};
    if (!pSerializedObj)
    {
        UNEXPECTED(ObjectTypeStr, " '", pObject->GetDesc().Name, "' was not created by a serialization device.");
        return false;
    }
    const auto* Name = pSerializedObj->GetDesc().Name;

    std::lock_guard<std::mutex> Guard{Mtx};

    auto it_inserted = Objects.emplace(HashMapStringKey{Name, true}, pSerializedObj);
    if (!it_inserted.second && it_inserted.first->second != pSerializedObj)
    {
        if (*it_inserted.first->second != *pSerializedObj)
        {
            LOG_ERROR_MESSAGE(ObjectTypeStr, " with name '", Name, "' is already present in the archive. All objects must use distinct names.");
            return false;
        }
    }

    return true;
}